

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void kj::resetCrashHandlers(void)

{
  int iVar1;
  Fault f;
  Fault local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  sigaction local_a0;
  
  memset(&local_a0,0,0x98);
  do {
    iVar1 = sigaction(0xb,&local_a0,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001aad20;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_c0.exception = (Exception *)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    _::Debug::Fault::init
              (&local_c0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_c0);
  }
LAB_001aad20:
  do {
    iVar1 = sigaction(7,&local_a0,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001aad49;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_c0.exception = (Exception *)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    _::Debug::Fault::init
              (&local_c0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_c0);
  }
LAB_001aad49:
  do {
    iVar1 = sigaction(8,&local_a0,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001aad72;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_c0.exception = (Exception *)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    _::Debug::Fault::init
              (&local_c0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_c0);
  }
LAB_001aad72:
  do {
    iVar1 = sigaction(6,&local_a0,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001aad9b;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_c0.exception = (Exception *)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    _::Debug::Fault::init
              (&local_c0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_c0);
  }
LAB_001aad9b:
  do {
    iVar1 = sigaction(4,&local_a0,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001aadc4;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_c0.exception = (Exception *)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    _::Debug::Fault::init
              (&local_c0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_c0);
  }
LAB_001aadc4:
  do {
    iVar1 = sigaction(0x1f,&local_a0,(sigaction *)0x0);
    if (-1 < iVar1) goto LAB_001aaded;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    local_c0.exception = (Exception *)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    _::Debug::Fault::init
              (&local_c0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception.c++"
              );
    _::Debug::Fault::fatal(&local_c0);
  }
LAB_001aaded:
  ::std::set_terminate((_func_void *)0x0);
  return;
}

Assistant:

void resetCrashHandlers() {
#ifndef _WIN32
  struct sigaction action;
  memset(&action, 0, sizeof(action));

  action.sa_handler = SIG_DFL;
  KJ_SYSCALL(sigaction(SIGSEGV, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGBUS, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGFPE, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGABRT, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGILL, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGSYS, &action, nullptr));

#ifdef KJ_DEBUG
  KJ_SYSCALL(sigaction(SIGINT, &action, nullptr));
#endif
#endif

  std::set_terminate(nullptr);
}